

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  int iVar1;
  undefined1 local_30 [8];
  timeval ctv;
  pcp_recv_msg_t *msg_local;
  pcp_flow_t *f_local;
  
  ctv.tv_usec = (__suseconds_t)msg;
  gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
  iVar1 = timeval_comp(&f->timeout,(timeval *)local_30);
  if (iVar1 < 0) {
    f_local._4_4_ = fev_failed;
  }
  else {
    f_local._4_4_ = fev_none;
  }
  return f_local._4_4_;
}

Assistant:

static pcp_flow_event_e fhndl_waitresp(pcp_flow_t *f,
                                       UNUSED pcp_recv_msg_t *msg) {
    struct timeval ctv;

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) < 0) {
        return fev_failed;
    }

    return fev_none;
}